

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cirs2obs.cpp
# Opt level: O0

void PrintResults(CEExecOptions *inputs,CESkyCoord *obs_coords,CESkyCoord *obs_cirs_coords,
                 CEAngle *hour_angle)

{
  long *plVar1;
  CEAngle *in_RCX;
  long *in_RDX;
  long *in_RSI;
  CLOptions *in_RDI;
  double dVar2;
  string *in_stack_fffffffffffffb70;
  CLOptions *in_stack_fffffffffffffb78;
  undefined8 in_stack_fffffffffffffb80;
  CEDateType date_format;
  allocator *paVar3;
  double in_stack_fffffffffffffb88;
  CEDate *in_stack_fffffffffffffb90;
  allocator local_321;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [32];
  undefined1 local_238 [64];
  CEAngle local_1f8;
  undefined1 local_1e8 [64];
  CEAngle local_1a8;
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [32];
  undefined1 local_120 [64];
  CEAngle local_e0;
  undefined1 local_d0 [64];
  CEAngle local_90 [2];
  undefined1 local_70 [64];
  CEAngle local_30;
  CEAngle *local_20;
  long *local_18;
  long *local_10;
  CLOptions *local_8;
  
  date_format = (CEDateType)((ulong)in_stack_fffffffffffffb80 >> 0x20);
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  printf("\n");
  printf("******************************************\n");
  printf("* Results of CIRS -> Observed conversion *\n");
  printf("******************************************\n");
  printf("Observed Coordinates (output)\n");
  plVar1 = local_10;
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,date_format);
  (**(code **)(*plVar1 + 0x18))(&local_30,plVar1,local_70);
  dVar2 = CEAngle::Deg(&local_30);
  printf("    Azimuth        : %f degrees\n",dVar2);
  CEAngle::~CEAngle((CEAngle *)0x13af9a);
  CEDate::~CEDate((CEDate *)0x13afa7);
  plVar1 = local_10;
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,date_format);
  (**(code **)(*plVar1 + 0x20))(local_90,plVar1,local_d0);
  dVar2 = CEAngle::Deg(local_90);
  printf("    Zenith         : %+f degrees\n",dVar2);
  CEAngle::~CEAngle((CEAngle *)0x13b034);
  CEDate::~CEDate((CEDate *)0x13b041);
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,date_format);
  (**(code **)(*local_10 + 0x20))(&local_e0,local_10,local_120);
  dVar2 = CEAngle::Deg(&local_e0);
  printf("    Altitude       : %+f degrees\n",90.0 - dVar2);
  CEAngle::~CEAngle((CEAngle *)0x13b0da);
  CEDate::~CEDate((CEDate *)0x13b0e7);
  printf("CIRS Coordinates (input)\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"ra",&local_141);
  dVar2 = CLOptions::AsDouble(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  printf("    Right Ascension: %f degrees\n",dVar2);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"dec",&local_169);
  dVar2 = CLOptions::AsDouble(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  printf("    Declination    : %+f degrees\n",dVar2);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"juliandate",&local_191);
  dVar2 = CLOptions::AsDouble(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  printf("    Julian Date    : %f\n",dVar2);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  printf("Apparent CIRS Coordinates\n");
  plVar1 = local_18;
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,date_format);
  (**(code **)(*plVar1 + 0x18))(&local_1a8,plVar1,local_1e8);
  dVar2 = CEAngle::Deg(&local_1a8);
  printf("    Right Ascension: %f\n",dVar2);
  CEAngle::~CEAngle((CEAngle *)0x13b35e);
  CEDate::~CEDate((CEDate *)0x13b36b);
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,date_format);
  (**(code **)(*local_18 + 0x20))(&local_1f8,local_18,local_238);
  dVar2 = CEAngle::Deg(&local_1f8);
  printf("    Declination    : %+f\n",dVar2);
  CEAngle::~CEAngle((CEAngle *)0x13b3f8);
  CEDate::~CEDate((CEDate *)0x13b405);
  CEAngle::Deg(local_20);
  printf("    Hour Angle     : %+f\n");
  printf("Observer Info\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"longitude",&local_259);
  dVar2 = CLOptions::AsDouble(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  printf("    Longitude      : %f deg\n",dVar2);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"latitude",&local_281);
  dVar2 = CLOptions::AsDouble(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  printf("    Latitude       : %+f deg\n",dVar2);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"elevation",&local_2a9);
  dVar2 = CLOptions::AsDouble(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  printf("    Elevation      : %f meters\n",dVar2);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"pressure",&local_2d1);
  dVar2 = CLOptions::AsDouble(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  printf("    Pressure       : %f hPa\n",dVar2);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"temperature",&local_2f9);
  dVar2 = CLOptions::AsDouble(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  printf("    Temperature    : %f Celsius\n",dVar2);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  paVar3 = &local_321;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"humidity",paVar3);
  dVar2 = CLOptions::AsDouble(local_8,in_stack_fffffffffffffb70);
  printf("    Relative Humid.: %f\n",dVar2);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  printf("\n");
  return;
}

Assistant:

void PrintResults(CEExecOptions&    inputs, 
                  const CESkyCoord& obs_coords,
                  const CESkyCoord& obs_cirs_coords,
                  const CEAngle&    hour_angle)
{
    std::printf("\n") ;
    std::printf("******************************************\n");
    std::printf("* Results of CIRS -> Observed conversion *\n");
    std::printf("******************************************\n");
    std::printf("Observed Coordinates (output)\n");
    std::printf("    Azimuth        : %f degrees\n", obs_coords.XCoord().Deg());
    std::printf("    Zenith         : %+f degrees\n", obs_coords.YCoord().Deg());
    std::printf("    Altitude       : %+f degrees\n", 90.0-obs_coords.YCoord().Deg());
    std::printf("CIRS Coordinates (input)\n");
    std::printf("    Right Ascension: %f degrees\n", inputs.AsDouble("ra"));
    std::printf("    Declination    : %+f degrees\n", inputs.AsDouble("dec"));
    std::printf("    Julian Date    : %f\n", inputs.AsDouble("juliandate"));
    std::printf("Apparent CIRS Coordinates\n");
    std::printf("    Right Ascension: %f\n", obs_cirs_coords.XCoord().Deg());
    std::printf("    Declination    : %+f\n", obs_cirs_coords.YCoord().Deg());
    std::printf("    Hour Angle     : %+f\n", hour_angle.Deg());
    std::printf("Observer Info\n");
    std::printf("    Longitude      : %f deg\n", inputs.AsDouble("longitude"));
    std::printf("    Latitude       : %+f deg\n", inputs.AsDouble("latitude"));
    std::printf("    Elevation      : %f meters\n", inputs.AsDouble("elevation"));
    std::printf("    Pressure       : %f hPa\n", inputs.AsDouble("pressure"));
    std::printf("    Temperature    : %f Celsius\n", inputs.AsDouble("temperature"));
    std::printf("    Relative Humid.: %f\n", inputs.AsDouble("humidity"));
    std::printf("\n");
}